

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::initializeOrdinal(Datetime *this,Pig *pig)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  tm *__tp;
  time_t tVar7;
  int local_58;
  int d;
  int m;
  int y;
  tm *t;
  time_t now;
  int remainder2;
  int remainder1;
  int character2;
  int character1;
  longlong number;
  size_type checkpoint;
  Pig *pig_local;
  Datetime *this_local;
  
  checkpoint = (size_type)pig;
  pig_local = (Pig *)this;
  number = Pig::cursor(pig);
  _character2 = 0;
  bVar4 = Pig::getDigits((Pig *)checkpoint,(longlong *)&character2);
  if ((((bVar4) && (0 < _character2)) && (_character2 < 0x20)) &&
     ((bVar4 = Pig::getCharacter((Pig *)checkpoint,&remainder1), bVar4 &&
      (bVar4 = Pig::getCharacter((Pig *)checkpoint,&remainder2), bVar4)))) {
    uVar5 = Pig::peek((Pig *)checkpoint);
    bVar4 = unicodeLatinAlpha(uVar5);
    if (!bVar4) {
      uVar5 = Pig::peek((Pig *)checkpoint);
      bVar4 = unicodeLatinDigit(uVar5);
      if (!bVar4) {
        now._4_4_ = (int)(_character2 % 10);
        now._0_4_ = (int)(_character2 % 100);
        if (((((((int)now != 0xb) && (now._4_4_ == 1)) &&
              ((remainder1 == 0x73 && (remainder2 == 0x74)))) ||
             (((((int)now != 0xc && (now._4_4_ == 2)) && (remainder1 == 0x6e)) &&
              (remainder2 == 100)))) ||
            ((((int)now != 0xd && (now._4_4_ == 3)) && ((remainder1 == 0x72 && (remainder2 == 100)))
             ))) || ((((((int)now == 0xb || ((int)now == 0xc)) ||
                       (((int)now == 0xd || ((now._4_4_ == 0 || (3 < now._4_4_)))))) &&
                      (remainder1 == 0x74)) && (remainder2 == 0x68)))) {
          t = (tm *)time((time_t *)0x0);
          __tp = localtime((time_t *)&t);
          lVar3 = _character2;
          iVar1 = __tp->tm_year;
          d = iVar1 + 0x76c;
          iVar2 = __tp->tm_mon;
          local_58 = iVar2 + 1;
          if ((((timeRelative & 1U) == 0) || (_character2 < 1)) || (__tp->tm_mday < _character2)) {
            if ((((timeRelative & 1U) == 0) && (__tp->tm_mday < _character2)) &&
               ((iVar6 = daysInMonth(d,local_58), lVar3 <= iVar6 && (local_58 = iVar2, iVar2 < 1))))
            {
              local_58 = 0xc;
              d = iVar1 + 0x76b;
            }
          }
          else {
            local_58 = iVar2 + 2;
            if (0xc < local_58) {
              local_58 = 1;
              d = iVar1 + 0x76d;
            }
          }
          __tp->tm_sec = 0;
          __tp->tm_min = 0;
          __tp->tm_hour = 0;
          __tp->tm_mon = local_58 + -1;
          __tp->tm_mday = (int)_character2;
          __tp->tm_year = d + -0x76c;
          __tp->tm_isdst = -1;
          tVar7 = mktime(__tp);
          this->_date = tVar7;
          return true;
        }
      }
    }
  }
  Pig::restoreTo((Pig *)checkpoint,number);
  return false;
}

Assistant:

bool Datetime::initializeOrdinal (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  long long number = 0;
  if (pig.getDigits (number) &&
      number > 0             &&
      number <= 31)
  {
    int character1;
    int character2;
    if (pig.getCharacter (character1)     &&
        pig.getCharacter (character2)     &&
        ! unicodeLatinAlpha (pig.peek ()) &&
        ! unicodeLatinDigit (pig.peek ()))
    {
      int remainder1 = number % 10;
      int remainder2 = number % 100;
      if ((remainder2 != 11 && remainder1 == 1 && character1 == 's' && character2 == 't') ||
          (remainder2 != 12 && remainder1 == 2 && character1 == 'n' && character2 == 'd') ||
          (remainder2 != 13 && remainder1 == 3 && character1 == 'r' && character2 == 'd') ||
          ((remainder2 == 11 ||
            remainder2 == 12 ||
            remainder2 == 13 ||
            remainder1 == 0 ||
            remainder1 > 3) && character1 == 't' && character2 == 'h'))
      {
        time_t now = time (nullptr);
        struct tm* t = localtime (&now);

        int y = t->tm_year + 1900;
        int m = t->tm_mon + 1;
        int d = t->tm_mday;

        if (timeRelative && (1 <= number && number <= d))
        {
          if (++m > 12)
          {
            m = 1;
            y++;
          }
        }
        else if (!timeRelative && (d < number && number <= daysInMonth (y, m)))
        {
          if (--m < 1)
          {
            m = 12;
            y--;
          }
        }

        t->tm_hour = t->tm_min = t->tm_sec = 0;
        t->tm_mon  = m - 1;
        t->tm_mday = number;
        t->tm_year = y - 1900;
        t->tm_isdst = -1;

        _date = mktime (t);

        return true;
      }
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}